

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int codebook_decode_start(vorb *f,Codebook *c)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (c->lookup_type == '\0') {
    iVar2 = -1;
  }
  else {
    if (f->valid_bits < 10) {
      prep_huffman(f);
    }
    iVar2 = (int)c->fast_huffman[f->acc & 0x3ff];
    if (iVar2 < 0) {
      iVar2 = codebook_decode_scalar_raw(f,c);
      if (-1 < iVar2) {
        return iVar2;
      }
    }
    else {
      bVar1 = c->codeword_lengths[iVar2];
      f->acc = f->acc >> (bVar1 & 0x1f);
      iVar4 = f->valid_bits - (uint)bVar1;
      iVar3 = 0;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      f->valid_bits = iVar3;
      if (-1 < iVar4) {
        return iVar2;
      }
      iVar2 = -1;
    }
    if ((f->bytes_in_seg == '\0') && (f->last_seg != 0)) {
      return iVar2;
    }
  }
  f->error = VORBIS_invalid_stream;
  return iVar2;
}

Assistant:

static int codebook_decode_start(vorb *f, Codebook *c)
{
   int z = -1;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)
      error(f, VORBIS_invalid_stream);
   else {
      DECODE_VQ(z,f,c);
      if (c->sparse) assert(z < c->sorted_entries);
      if (z < 0) {  // check for EOP
         if (!f->bytes_in_seg)
            if (f->last_seg)
               return z;
         error(f, VORBIS_invalid_stream);
      }
   }
   return z;
}